

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O1

bool CB_ALGS::know_all_cost_example(label *ld)

{
  cb_class *pcVar1;
  float *pfVar2;
  cb_class *pcVar3;
  bool bVar4;
  
  pcVar3 = (ld->costs)._begin;
  pcVar1 = (ld->costs)._end;
  if ((ulong)((long)pcVar1 - (long)pcVar3) < 0x11) {
    return false;
  }
  bVar4 = pcVar3 == pcVar1;
  if ((!bVar4) && ((pcVar3->cost != 3.4028235e+38 || (NAN(pcVar3->cost))))) {
    pcVar3 = pcVar3 + 1;
    do {
      bVar4 = pcVar3 == pcVar1;
      if (bVar4) {
        return bVar4;
      }
      pfVar2 = &pcVar3->cost;
      pcVar3 = pcVar3 + 1;
    } while ((*pfVar2 != 3.4028235e+38) || (NAN(*pfVar2)));
  }
  return bVar4;
}

Assistant:

inline size_t size() const { return _end - _begin; }